

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

int __thiscall Fl_Window_Type::open(Fl_Window_Type *this,char *__file,int __oflag,...)

{
  Fl_Window *this_00;
  int minh;
  int iVar1;
  int maxw;
  int maxh;
  int extraout_EAX;
  Fl_Widget *o;
  int __oflag_00;
  Fl_Widget *p;
  Overlay_Window *w;
  Fl_Window_Type *this_local;
  
  this_00 = (Fl_Window *)(this->super_Fl_Widget_Type).o;
  iVar1 = Fl_Window::shown(this_00);
  if (iVar1 == 0) {
    o = Fl_Group::resizable((Fl_Group *)this_00);
    if (o == (Fl_Widget *)0x0) {
      Fl_Group::resizable((Fl_Group *)this_00,(Fl_Widget *)this_00);
    }
    (*(this_00->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
    Fl_Group::resizable((Fl_Group *)this_00,o);
  }
  else {
    (*(this_00->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
    Fl_Widget_Type::open(&this->super_Fl_Widget_Type,__file,__oflag_00);
  }
  Fl_Widget::image((Fl_Widget *)this_00,Fl::scheme_bg_);
  minh = gridy;
  iVar1 = gridx;
  maxw = Fl::w();
  maxh = Fl::h();
  Fl_Window::size_range(this_00,iVar1,minh,maxw,maxh,gridx,gridy,0);
  return extraout_EAX;
}

Assistant:

void Fl_Window_Type::open() {
  Overlay_Window *w = (Overlay_Window *)o;
  if (w->shown()) {
    w->show();
    Fl_Widget_Type::open();
  } else {
    Fl_Widget *p = w->resizable();
    if (!p) w->resizable(w);
    w->show();
    w->resizable(p);
  }

  w->image(Fl::scheme_bg_);
  w->size_range(gridx, gridy, Fl::w(), Fl::h(), gridx, gridy, 0);
}